

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDeviceUtil.cpp
# Opt level: O3

Move<vk::VkInstance_s_*> *
vk::createDefaultInstance
          (Move<vk::VkInstance_s_*> *__return_storage_ptr__,PlatformInterface *vkPlatform,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *enabledLayers,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *enabledExtensions,VkAllocationCallbacks *pAllocator)

{
  deUint32 dVar1;
  long lVar2;
  ulong uVar3;
  pointer pbVar4;
  vector<const_char_*,_std::allocator<const_char_*>_> extensionNamePtrs;
  vector<const_char_*,_std::allocator<const_char_*>_> layerNamePtrs;
  VkInstanceCreateInfo instanceInfo;
  VkApplicationInfo appInfo;
  vector<const_char_*,_std::allocator<const_char_*>_> local_d8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_c0;
  PlatformInterface *local_a8;
  VkInstanceCreateInfo local_a0;
  VkApplicationInfo local_60;
  
  local_a8 = vkPlatform;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_c0,
             (long)(enabledLayers->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(enabledLayers->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_a0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_d8,
             (long)(enabledExtensions->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(enabledExtensions->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_a0);
  local_a0.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_a0._4_4_ = 0;
  local_a0.pNext = (void *)((ulong)local_a0.pNext._4_4_ << 0x20);
  dVar1 = pack((ApiVersion *)&local_a0);
  local_60.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_60.pNext = (void *)0x0;
  local_60.pApplicationName = "deqp";
  local_60.applicationVersion = qpGetReleaseId();
  local_60.pEngineName = "deqp";
  local_60.engineVersion = qpGetReleaseId();
  local_a0.pApplicationInfo = &local_60;
  local_a0.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_a0.pNext = (void *)0x0;
  local_a0.flags = 0;
  local_a0.ppEnabledLayerNames =
       local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((long)local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    local_a0.ppEnabledLayerNames = (pointer)0x0;
  }
  local_a0.enabledLayerCount =
       (deUint32)
       ((ulong)((long)local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_a0.ppEnabledExtensionNames =
       local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    local_a0.ppEnabledExtensionNames = (pointer)0x0;
  }
  local_a0.enabledExtensionCount =
       (deUint32)
       ((ulong)((long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 3);
  pbVar4 = (enabledLayers->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((enabledLayers->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] =
           *(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar2);
      uVar3 = uVar3 + 1;
      pbVar4 = (enabledLayers->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < (ulong)((long)(enabledLayers->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5))
    ;
  }
  pbVar4 = (enabledExtensions->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((enabledExtensions->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] =
           *(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar2);
      uVar3 = uVar3 + 1;
      pbVar4 = (enabledExtensions->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < (ulong)((long)(enabledExtensions->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5))
    ;
  }
  local_60.apiVersion = dVar1;
  createInstance(__return_storage_ptr__,local_a8,&local_a0,pAllocator);
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkInstance> createDefaultInstance (const PlatformInterface&		vkPlatform,
										const vector<string>&			enabledLayers,
										const vector<string>&			enabledExtensions,
										const VkAllocationCallbacks*	pAllocator)
{
	vector<const char*>		layerNamePtrs		(enabledLayers.size());
	vector<const char*>		extensionNamePtrs	(enabledExtensions.size());
	const deUint32			apiVersion			= pack(ApiVersion(1, 0, 0));

	const struct VkApplicationInfo		appInfo			=
	{
		VK_STRUCTURE_TYPE_APPLICATION_INFO,
		DE_NULL,
		"deqp",									// pAppName
		qpGetReleaseId(),						// appVersion
		"deqp",									// pEngineName
		qpGetReleaseId(),						// engineVersion
		apiVersion								// apiVersion
	};
	const struct VkInstanceCreateInfo	instanceInfo	=
	{
		VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,
		DE_NULL,
		(VkInstanceCreateFlags)0,
		&appInfo,
		(deUint32)layerNamePtrs.size(),
		layerNamePtrs.empty() ? DE_NULL : &layerNamePtrs[0],
		(deUint32)extensionNamePtrs.size(),
		extensionNamePtrs.empty() ? DE_NULL : &extensionNamePtrs[0],
	};

	for (size_t ndx = 0; ndx < enabledLayers.size(); ++ndx)
		layerNamePtrs[ndx] = enabledLayers[ndx].c_str();

	for (size_t ndx = 0; ndx < enabledExtensions.size(); ++ndx)
		extensionNamePtrs[ndx] = enabledExtensions[ndx].c_str();

	return createInstance(vkPlatform, &instanceInfo, pAllocator);
}